

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_13.cpp
# Opt level: O2

int main(void)

{
  ostream *poVar1;
  long lVar2;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  allocator_type local_205;
  allocator<char> local_204;
  allocator<char> local_203;
  allocator<char> local_202;
  allocator<char> local_201;
  allocator<char> local_200;
  allocator<char> local_1ff;
  allocator<char> local_1fe;
  allocator<char> local_1fd;
  allocator<char> local_1fc;
  allocator<char> local_1fb;
  allocator<char> local_1fa;
  allocator<char> local_1f9;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  strings;
  vector<unsigned_long,_std::allocator<unsigned_long>_> lengths;
  StringData sd;
  string local_148 [32];
  string local_128 [32];
  string local_108 [32];
  string local_e8 [32];
  string local_c8 [32];
  string local_a8 [32];
  string local_88 [32];
  string local_68 [32];
  string local_48 [32];
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&sd,"When",(allocator<char> *)&lengths);
  std::__cxx11::string::string<std::allocator<char>>((string *)&sd.shortest,"you",&local_1f9);
  std::__cxx11::string::string<std::allocator<char>>((string *)&sd.first,"have",&local_1fa);
  std::__cxx11::string::string<std::allocator<char>>((string *)&sd.last,"exhausted",&local_1fb);
  std::__cxx11::string::string<std::allocator<char>>(local_148,"all",&local_1fc);
  std::__cxx11::string::string<std::allocator<char>>(local_128,"posibilities",&local_1fd);
  std::__cxx11::string::string<std::allocator<char>>(local_108,",",&local_1fe);
  std::__cxx11::string::string<std::allocator<char>>(local_e8,"remember",&local_1ff);
  std::__cxx11::string::string<std::allocator<char>>(local_c8,"this",&local_200);
  std::__cxx11::string::string<std::allocator<char>>(local_a8,"-",&local_201);
  std::__cxx11::string::string<std::allocator<char>>(local_88,"you",&local_202);
  std::__cxx11::string::string<std::allocator<char>>(local_68,"haven\'t",&local_203);
  std::__cxx11::string::string<std::allocator<char>>(local_48,".",&local_204);
  __l._M_len = 0xd;
  __l._M_array = &sd.longest;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&strings,__l,&local_205);
  lVar2 = 0x180;
  do {
    std::__cxx11::string::~string(local_148 + lVar2 + -0x80);
    lVar2 = lVar2 + -0x20;
  } while (lVar2 != -0x20);
  str_lengths(&lengths,&strings);
  analyze_strings(&sd,&strings);
  poVar1 = std::operator<<((ostream *)&std::cout,"Longest: \'");
  poVar1 = std::operator<<(poVar1,(string *)&sd);
  poVar1 = std::operator<<(poVar1,"\'\nShortest: \'");
  poVar1 = std::operator<<(poVar1,(string *)&sd.shortest);
  poVar1 = std::operator<<(poVar1,"\'\nLexicographically first: \'");
  poVar1 = std::operator<<(poVar1,(string *)&sd.first);
  poVar1 = std::operator<<(poVar1,"\'\nLexicographically last: \'");
  poVar1 = std::operator<<(poVar1,(string *)&sd.last);
  std::operator<<(poVar1,"\'\n");
  StringData::~StringData(&sd);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&lengths.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&strings);
  return 0;
}

Assistant:

int main()
{
	try
	{
		std::vector<std::string> strings{
			"When", "you", "have", "exhausted", "all", "posibilities", ",", "remember",
			"this", "-", "you", "haven't", "."
		};

		auto lengths = str_lengths(strings);
		auto sd = analyze_strings(strings);

		std::cout << "Longest: '" << sd.longest
			<< "'\nShortest: '" << sd.shortest
			<< "'\nLexicographically first: '" << sd.first
			<< "'\nLexicographically last: '" << sd.last
			<< "'\n";
	}
	catch (const std::exception& e)
	{
		std::cerr << e.what() << std::endl;
	}
	return 0;
}